

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O2

longlong MercuryJson::parse_number(char *input,bool *is_decimal,size_t offset)

{
  char *pcVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 *puVar6;
  size_t offset_00;
  undefined1 (*pauVar7) [16];
  longlong lVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM8_Qa;
  undefined1 auVar30 [16];
  undefined8 in_XMM10_Qb;
  allocator<char> local_71;
  string local_70;
  char *local_50;
  double local_48;
  
  cVar2 = input[offset];
  pcVar1 = input + offset;
  pauVar7 = (undefined1 (*) [16])(pcVar1 + (cVar2 == '-'));
  if (pcVar1[cVar2 == '-'] == '0') {
    if ((byte)((*pauVar7)[1] - 0x30) < 10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"numbers cannot have leading zeros",&local_71);
      __error(&local_70,input,offset);
    }
    pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
    lVar13 = 0;
  }
  else {
    if ((byte)(pcVar1[cVar2 == '-'] - 0x3aU) < 0xf6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"numbers must have integer parts",&local_71);
      __error(&local_70,input,offset);
    }
    uVar11 = *(ulong *)*pauVar7;
    auVar18[8] = 0xd0;
    auVar18._0_8_ = 0xd0d0d0d0d0d0d0d0;
    auVar18[9] = 0xd0;
    auVar18[10] = 0xd0;
    auVar18[0xb] = 0xd0;
    auVar18[0xc] = 0xd0;
    auVar18[0xd] = 0xd0;
    auVar18[0xe] = 0xd0;
    auVar18[0xf] = 0xd0;
    auVar19._8_2_ = 0x10a;
    auVar19._0_8_ = 0x10a010a010a010a;
    auVar19._10_2_ = 0x10a;
    auVar19._12_2_ = 0x10a;
    auVar19._14_2_ = 0x10a;
    auVar24._8_4_ = 0x10064;
    auVar24._0_8_ = 0x1006400010064;
    auVar24._12_4_ = 0x10064;
    lVar13 = 0;
    while (lVar20 = psubusb(CONCAT17((char)(uVar11 >> 0x38) + -0x30,
                                     CONCAT16((char)(uVar11 >> 0x30) + -0x30,
                                              CONCAT15((char)(uVar11 >> 0x28) + -0x30,
                                                       CONCAT14((char)(uVar11 >> 0x20) + -0x30,
                                                                CONCAT13((char)(uVar11 >> 0x18) +
                                                                         -0x30,CONCAT12((char)(
                                                  uVar11 >> 0x10) + -0x30,
                                                  (short)CONCAT71((int7)(uVar11 >> 8),
                                                                  (char)uVar11 + -0x30))))))),
                            0x909090909090909), lVar20 == 0) {
      auVar22 = *pauVar7;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
      auVar25 = vpaddb_avx(auVar22,auVar18);
      auVar25 = vpmaddubsw_avx(auVar25,auVar19);
      auVar25 = vpmaddwd_avx(auVar25,auVar24);
      auVar25 = vpackusdw_avx(auVar25,auVar25);
      auVar25 = vpmaddwd_avx(auVar25,SUB6416(ZEXT464(0x12710),0));
      lVar13 = CONCAT44((int)((ulong)lVar13 >> 0x20),auVar25._0_4_) + lVar13 * 100000000;
      uVar11 = vpextrq_avx(auVar22,1);
    }
    while (bVar12 = (char)uVar11 - 0x30, bVar12 < 10) {
      puVar6 = *pauVar7;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
      lVar13 = (ulong)bVar12 + lVar13 * 10;
      uVar11 = (ulong)(byte)puVar6[1];
    }
  }
  if ((ulong)((long)pauVar7 - (long)pcVar1) < 0x13) {
    uVar10 = (uint)(byte)(*pauVar7)[0];
    if ((*pauVar7)[0] == 0x2e) {
      uVar11 = *(ulong *)(*pauVar7 + 1);
      auVar23 = ZEXT1664(ZEXT816(0x3fb999999999999a));
      auVar25[8] = 0xd0;
      auVar25._0_8_ = 0xd0d0d0d0d0d0d0d0;
      auVar25[9] = 0xd0;
      auVar25[10] = 0xd0;
      auVar25[0xb] = 0xd0;
      auVar25[0xc] = 0xd0;
      auVar25[0xd] = 0xd0;
      auVar25[0xe] = 0xd0;
      auVar25[0xf] = 0xd0;
      auVar27._8_2_ = 0x10a;
      auVar27._0_8_ = 0x10a010a010a010a;
      auVar27._10_2_ = 0x10a;
      auVar27._12_2_ = 0x10a;
      auVar27._14_2_ = 0x10a;
      auVar29._8_4_ = 0x10064;
      auVar29._0_8_ = 0x1006400010064;
      auVar29._12_4_ = 0x10064;
      auVar22._0_8_ = (double)lVar13;
      auVar22._8_8_ = in_XMM8_Qa;
      offset_00 = (long)pauVar7 - (long)input;
      pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
      while (lVar20 = psubusb(CONCAT17((char)(uVar11 >> 0x38) + -0x30,
                                       CONCAT16((char)(uVar11 >> 0x30) + -0x30,
                                                CONCAT15((char)(uVar11 >> 0x28) + -0x30,
                                                         CONCAT14((char)(uVar11 >> 0x20) + -0x30,
                                                                  CONCAT13((char)(uVar11 >> 0x18) +
                                                                           -0x30,CONCAT12((char)(
                                                  uVar11 >> 0x10) + -0x30,
                                                  (short)CONCAT71((int7)(uVar11 >> 8),
                                                                  (char)uVar11 + -0x30))))))),
                              0x909090909090909), lVar20 == 0) {
        auVar18 = *pauVar7;
        pauVar7 = (undefined1 (*) [16])(*pauVar7 + 8);
        offset_00 = offset_00 + 8;
        auVar19 = vpaddb_avx(auVar18,auVar25);
        uVar11 = vpextrq_avx(auVar18,1);
        auVar18 = vpmaddubsw_avx(auVar19,auVar27);
        auVar18 = vpmaddwd_avx(auVar18,auVar29);
        auVar18 = vpackusdw_avx(auVar18,auVar18);
        auVar18 = vpmaddwd_avx(auVar18,SUB6416(ZEXT464(0x12710),0));
        auVar18 = vcvtudq2pd_avx512vl(auVar18);
        dVar21 = auVar23._0_8_;
        auVar23 = ZEXT864((ulong)(dVar21 * 1e-08));
        auVar30._8_8_ = 0;
        auVar30._0_8_ = auVar18._0_8_ * dVar21;
        auVar22 = vfmadd231sd_fma(auVar22,auVar30,ZEXT816(0x3e7ad7f29abcaf48));
      }
      while( true ) {
        uVar10 = (uint)uVar11;
        bVar12 = (char)uVar11 - 0x30;
        dVar21 = auVar23._0_8_;
        if (9 < bVar12) break;
        offset_00 = offset_00 + 1;
        auVar28._0_8_ = (double)(int)(char)bVar12;
        auVar28._8_8_ = in_XMM10_Qb;
        uVar11 = (ulong)(byte)(*pauVar7)[1];
        pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
        auVar22 = vfmadd231sd_fma(auVar22,auVar23._0_16_,auVar28);
        auVar23 = ZEXT864((ulong)(dVar21 * 0.1));
      }
      bVar16 = true;
      if ((dVar21 == 0.1) && (!NAN(dVar21))) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"excessive characters at end of number",&local_71);
        __error(&local_70,input,offset_00);
      }
    }
    else {
      auVar22 = (undefined1  [16])0x0;
      bVar16 = false;
    }
    cVar9 = (char)uVar10;
    local_50 = input;
    if ((uVar10 & 0xff | 0x20) == 0x65) {
      bVar15 = true;
      if (bVar16 != false) {
        bVar15 = bVar16;
      }
      cVar9 = (*pauVar7)[1];
      bVar17 = (cVar9 - 0x2bU & 0xfd) == 0;
      pauVar14 = (undefined1 (*) [16])(*pauVar7 + 1);
      if (bVar17) {
        pauVar14 = (undefined1 (*) [16])(*pauVar7 + 2);
      }
      bVar12 = (*pauVar7)[(ulong)bVar17 + 1];
      if ((byte)(bVar12 - 0x3a) < 0xf6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"numbers must not have null exponents",&local_71);
        __error(&local_70,local_50,(long)pauVar14 - (long)local_50);
      }
      local_48 = (double)((ulong)bVar16 * auVar22._0_8_ + (ulong)!bVar16 * (long)(double)lVar13);
      auVar18 = ZEXT816(0) << 0x40;
      do {
        auVar26._0_8_ = (double)(int)(bVar12 - 0x30);
        auVar26._8_8_ = in_XMM10_Qb;
        bVar12 = (*pauVar14)[1];
        pauVar14 = (undefined1 (*) [16])(*pauVar14 + 1);
        auVar18 = vfmadd132sd_fma(auVar18,auVar26,ZEXT816(0x4024000000000000));
      } while ((byte)(bVar12 - 0x30) < 10);
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar19 = vandpd_avx512vl(auVar18,auVar3);
      if (308.0 < auVar19._0_8_) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"decimal exponent out of range",&local_71);
        __error(&local_70,local_50,offset);
      }
      auVar4._8_8_ = 0x8000000000000000;
      auVar4._0_8_ = 0x8000000000000000;
      auVar19 = vxorpd_avx512vl(auVar18,auVar4);
      dVar21 = pow(10.0,(double)((ulong)(cVar9 == '-') * auVar19._0_8_ +
                                (ulong)(cVar9 != '-') * auVar18._0_8_));
      auVar22._8_8_ = 0;
      auVar22._0_8_ = dVar21 * local_48;
      cVar9 = (*pauVar14)[0];
      pauVar7 = pauVar14;
      bVar16 = bVar15;
    }
    dVar21 = auVar22._0_8_;
    if (*(long *)(kStructuralOrWhitespace + (long)cVar9 * 8) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"excessive characters at end of number",&local_71);
      __error(&local_70,local_50,(long)pauVar7 - (long)local_50);
    }
    *is_decimal = bVar16;
    if (cVar2 == '-') {
      if (bVar16 == false) {
        return -lVar13;
      }
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar18 = vxorpd_avx512vl(auVar22,auVar5);
      dVar21 = auVar18._0_8_;
    }
    else if (bVar16 == false) {
      return lVar13;
    }
    lVar8 = plain_convert(dVar21);
    return lVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"integer part too large",&local_71);
  __error(&local_70,input,offset);
}

Assistant:

long long int parse_number(const char *input, bool *is_decimal, size_t offset) {
#if NO_PARSE_NUMBER
        *is_decimal = false;
        return 0LL;
#endif
        const char *s = input + offset;
        long long int integer = 0LL;
        double decimal = 0.0;
        bool negative = false, _is_decimal = false;
        if (*s == '-') {
            ++s;
            negative = true;
        }
        if (*s == '0') {
            ++s;
            if (*s >= '0' && *s <= '9')
                __error("numbers cannot have leading zeros", input, offset);
        } else {
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must have integer parts", input, offset);
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                integer = integer * 100000000 + _parse_eight_digits(s);
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9')
                integer = integer * 10 + (*s++ - '0');
        }
        if (s - input - offset > 18)
            __error("integer part too large", input, offset);
        if (*s == '.') {
            _is_decimal = true;
            decimal = integer;
            double multiplier = 0.1;
            ++s;
#if PARSE_NUMBER_AVX
            while (_all_digits(s)) {
                decimal += _parse_eight_digits(s) * multiplier * 0.0000001;  // 7 digits
                multiplier *= 0.00000001;  // 8 digits
                s += 8;
            }
#endif
            while (*s >= '0' && *s <= '9') {
                decimal += (*s++ - '0') * multiplier;
                multiplier *= 0.1;
            }if (multiplier == 0.1)
                __error("excessive characters at end of number", input, s - input - 1);
        }
        if (*s == 'e' || *s == 'E') {
            if (!_is_decimal) {
                _is_decimal = true;
                decimal = integer;
            }
            ++s;
            bool negative_exp = false;
            if (*s == '-') {
                negative_exp = true;
                ++s;
            } else if (*s == '+') ++s;
            double exponent = 0.0;
            if (*s < '0' || *s > '9')
                MercuryJson::__error("numbers must not have null exponents", input, s - input);
            do {
                exponent = exponent * 10.0 + (*s++ - '0');
            } while (*s >= '0' && *s <= '9');
            if (negative_exp) exponent = -exponent;
            if (exponent < -308 || exponent > 308)
                __error("decimal exponent out of range", input, offset);
            decimal *= pow(10.0, exponent);
        }
        if (!kStructuralOrWhitespace[*s])
            __error("excessive characters at end of number", input, s - input);
        *is_decimal = _is_decimal;
        if (negative) {
            if (_is_decimal) return plain_convert(-decimal);
            else return -integer;
        } else {
            if (_is_decimal) return plain_convert(decimal);
            else return integer;
        }
    }